

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.hpp
# Opt level: O1

void __thiscall
vkt::pipeline::ColorVertexShader::shadeVertices
          (ColorVertexShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  ulong uVar2;
  Vec4 position;
  Vec4 color;
  Vec4 local_58;
  Vec4 local_48;
  
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 0.0;
  if (0 < numPackets) {
    uVar2 = 0;
    do {
      pVVar1 = packets[uVar2];
      rr::readVertexAttrib(&local_58,inputs,pVVar1->instanceNdx,pVVar1->vertexNdx);
      rr::readVertexAttrib(&local_48,inputs + 1,pVVar1->instanceNdx,pVVar1->vertexNdx);
      pVVar1->outputs[0].v.uData[0] = (deUint32)local_58.m_data[0];
      pVVar1->outputs[0].v.uData[1] = (deUint32)local_58.m_data[1];
      pVVar1->outputs[0].v.uData[2] = (deUint32)local_58.m_data[2];
      pVVar1->outputs[0].v.uData[3] = (deUint32)local_58.m_data[3];
      pVVar1[1].instanceNdx = (int)local_48.m_data[0];
      pVVar1[1].vertexNdx = (int)local_48.m_data[1];
      pVVar1[1].position.m_data[0] = local_48.m_data[2];
      pVVar1[1].position.m_data[1] = local_48.m_data[3];
      *(undefined8 *)(pVVar1->position).m_data = local_58.m_data._0_8_;
      *(undefined8 *)((pVVar1->position).m_data + 2) = local_58.m_data._8_8_;
      uVar2 = uVar2 + 1;
    } while ((uint)numPackets != uVar2);
  }
  return;
}

Assistant:

virtual ~CoordinateCaptureFragmentShader (void)
	{
	}